

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O1

djg_mesh * djgm_load_cone(int slices,int stacks)

{
  djgm_vertex *pdVar1;
  uint uVar2;
  djg_mesh *pdVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  pdVar3 = djgm_load_plane(slices,stacks);
  if (-2 < slices) {
    uVar2 = stacks + 2;
    uVar5 = 1;
    if (1 < (int)uVar2) {
      uVar5 = (ulong)uVar2;
    }
    lVar4 = 0x38;
    uVar7 = 0;
    do {
      if (-2 < stacks) {
        pdVar1 = pdVar3->vertexv;
        lVar6 = 0;
        do {
          fVar10 = *(float *)((long)pdVar1 + lVar6 + lVar4 + -0x28);
          fVar9 = *(float *)((long)pdVar1 + lVar6 + lVar4 + -0x24);
          fVar10 = (fVar10 + fVar10) * 3.1415927;
          fVar8 = cosf(fVar10);
          *(float *)((long)pdVar1 + lVar6 + lVar4 + -0x38) =
               fVar8 * *(float *)((long)pdVar1 + lVar6 + lVar4 + -0x24);
          fVar8 = sinf(fVar10);
          *(float *)((long)pdVar1 + lVar6 + lVar4 + -0x34) =
               fVar8 * *(float *)((long)pdVar1 + lVar6 + lVar4 + -0x24);
          *(float *)((long)pdVar1 + lVar6 + lVar4 + -0x30) = fVar9 + fVar9 + -1.0;
          fVar9 = sinf(fVar10);
          *(float *)((long)pdVar1 + lVar6 + lVar4 + -0x18) = -fVar9;
          fVar9 = cosf(fVar10);
          *(float *)((long)pdVar1 + lVar6 + lVar4 + -0x14) = fVar9;
          *(undefined4 *)((long)pdVar1 + lVar6 + lVar4 + -0x10) = 0;
          fVar9 = cosf(fVar10);
          *(float *)((long)pdVar1 + lVar6 + lVar4 + -8) = fVar9 * 0.70710677;
          fVar10 = sinf(fVar10);
          *(float *)((long)pdVar1 + lVar6 + lVar4 + -4) = fVar10 * 0.70710677;
          *(undefined4 *)((long)&(pdVar1->p).x + lVar6 + lVar4) = 0x3f3504f3;
          lVar6 = lVar6 + 0x40;
        } while (uVar5 * 0x40 != lVar6);
      }
      uVar7 = uVar7 + 1;
      lVar4 = lVar4 + (long)(int)uVar2 * 0x40;
    } while (uVar7 != slices + 2);
  }
  return pdVar3;
}

Assistant:

DJGDEF djg_mesh *
djgm_load_cone(int slices, int stacks)
{
    djg_mesh *mesh = djgm_load_plane(slices, stacks);;
    int i, j;

    slices+= 2;
    stacks+= 2;

    for (i = 0; i < slices; ++i)
    for (j = 0; j < stacks; ++j) {
        djgm_vertex *v = &mesh->vertexv[i * stacks + j];
        float phi = v->st.s * 2 * M_PI;
        float z = 2 * v->st.t - 1;
        float nrm = sqrt(2.f) / 2.f;

        v->p.x = cos(phi)* v->st.t;
        v->p.y = sin(phi)* v->st.t;
        v->p.z = z;

        v->dpds.x = -sin(phi);
        v->dpds.y = +cos(phi);
        v->dpds.z = 0;

        v->dpdt.x = cos(phi) * nrm;
        v->dpdt.y = sin(phi) * nrm;
        v->dpdt.z = nrm;
    }

    return mesh;
}